

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

QString * waitForError<QString>
                    (QString *__return_storage_ptr__,QPromise<void> *promise,QString *initial)

{
  QPromiseBase<void> local_48;
  QPromiseBase<void> local_38;
  undefined1 local_21;
  QString *local_20;
  QString *initial_local;
  QPromise<void> *promise_local;
  QString *error;
  
  local_21 = 0;
  local_20 = initial;
  initial_local = (QString *)promise;
  promise_local = (QPromise<void> *)__return_storage_ptr__;
  QString::QString(__return_storage_ptr__,initial);
  QtPromise::QPromiseBase<void>::
  fail<waitForError<QString>(QtPromise::QPromise<void>const&,QString_const&)::_lambda(QString_const&)_1_>
            (&local_48,(anon_class_8_1_a7dec128 *)initial_local);
  QtPromise::QPromiseBase<void>::wait(&local_38,&local_48);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_38);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

static inline E waitForError(const QtPromise::QPromise<void>& promise, const E& initial)
{
    E error(initial);
    promise
        .fail([&](const E& err) {
            error = err;
        })
        .wait();
    return error;
}